

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall cmListFile::ParseFile(cmListFile *this,char *filename,bool topLevel,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  pointer pcVar4;
  iterator iVar5;
  pointer s;
  string name;
  cmListFileParser parser;
  value_type local_f0;
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  cmListFile local_b0;
  undefined1 auStack_98 [24];
  FILE *local_80;
  pointer pcStack_78;
  pointer local_70;
  pointer pcStack_68;
  cmMakefile *local_58;
  char **local_50;
  long local_48;
  char *local_40 [2];
  
  bVar2 = cmsys::SystemTools::FileExists(filename);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_c0,filename,(allocator *)&local_f0);
    bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_c0);
    if (local_c0 != (undefined1  [8])&local_b0) {
      operator_delete((void *)local_c0,
                      (long)local_b0.Functions.
                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    if (!bVar2) {
      local_c0 = (undefined1  [8])this;
      local_b8 = (undefined1  [8])mf;
      local_b0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)filename;
      local_b0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)cmListFileLexer_New();
      auStack_98._0_8_ = (pointer)0x0;
      auStack_98._8_8_ = auStack_98._8_8_ & 0xffffffffffffff00;
      local_80 = (FILE *)0x0;
      pcStack_78 = (pointer)0x0;
      local_70 = (pointer)0x0;
      pcStack_68 = (pointer)0x0;
      local_b0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(auStack_98 + 8);
      bVar2 = cmListFileParser::ParseFile((cmListFileParser *)local_c0);
      cmListFileParser::~cmListFileParser((cmListFileParser *)local_c0);
      if (!topLevel) {
        return bVar2;
      }
      pcVar4 = (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      s = pcVar4;
      local_58 = mf;
      if (pcVar4 != (this->Functions).
                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmsys::SystemTools::LowerCase((string *)local_c0,(string *)s);
          iVar3 = std::__cxx11::string::compare((char *)local_c0);
          if (local_c0 != (undefined1  [8])&local_b0) {
            operator_delete((void *)local_c0,
                            (ulong)((long)local_b0.Functions.
                                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          if (iVar3 == 0) goto LAB_003bae01;
          s = s + 1;
        } while (s != (this->Functions).
                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
        pcVar4 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
      }
      if ((ulong)((long)s - (long)pcVar4) < 0x780) {
        local_b0.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_b8;
        local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffff00000000);
        local_b0.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        auStack_98._0_8_ = (pointer)0x0;
        paVar1 = &local_f0.Value.field_2;
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        local_b0.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_b0.Functions.
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"project","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"set","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"if","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"endif","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"else","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"elseif","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"add_executable","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"add_library","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"target_link_libraries","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"option","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"message","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_f0.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.Value._M_dataplus._M_p,
                          local_f0.Value.field_2._M_allocated_capacity + 1);
        }
        pcVar4 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (pcVar4 != (this->Functions).
                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          do {
            cmsys::SystemTools::LowerCase(&local_f0.Value,(string *)pcVar4);
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_c0,&local_f0.Value);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0.Value._M_dataplus._M_p != &local_f0.Value.field_2) {
              operator_delete(local_f0.Value._M_dataplus._M_p,
                              local_f0.Value.field_2._M_allocated_capacity + 1);
            }
            if (iVar5._M_node == (_Base_ptr)local_b8) {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_c0);
              goto LAB_003badea;
            }
            pcVar4 = pcVar4 + 1;
          } while (pcVar4 != (this->Functions).
                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c0);
      }
      else {
LAB_003badea:
        local_58->CheckCMP0000 = true;
        cmMakefile::SetPolicyVersion(local_58,"2.4");
      }
LAB_003bae01:
      pcVar4 = (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar4 != (this->Functions).
                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmsys::SystemTools::LowerCase((string *)local_c0,(string *)pcVar4);
          iVar3 = std::__cxx11::string::compare((char *)local_c0);
          if (local_c0 != (undefined1  [8])&local_b0) {
            operator_delete((void *)local_c0,
                            (ulong)((long)local_b0.Functions.
                                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          if (iVar3 == 0) {
            return bVar2;
          }
          pcVar4 = pcVar4 + 1;
        } while (pcVar4 != (this->Functions).
                           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_c0 = (undefined1  [8])&local_b0;
      local_b8 = (undefined1  [8])0x0;
      local_b0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_b0.Functions.
                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      local_b0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_98._0_8_ = (pointer)0x0;
      auStack_98._8_8_ = 0;
      auStack_98._16_8_ = 0;
      std::__cxx11::string::_M_replace((ulong)local_c0,0,(char *)0x0,0x4dffa7);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Project","");
      paVar1 = &local_f0.Value.field_2;
      local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_50,local_48 + (long)local_50);
      local_f0.Delim = Unquoted;
      local_f0.Line = 0;
      if (local_50 != local_40) {
        operator_delete(local_50,(ulong)(local_40[0] + 1));
      }
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)auStack_98,
                 &local_f0);
      std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                (&this->Functions,
                 (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start,(value_type *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.Value._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0.Value._M_dataplus._M_p,
                        local_f0.Value.field_2._M_allocated_capacity + 1);
      }
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)auStack_98);
      if (local_c0 == (undefined1  [8])&local_b0) {
        return bVar2;
      }
      operator_delete((void *)local_c0,
                      (long)local_b0.Functions.
                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool cmListFile::ParseFile(const char* filename,
                           bool topLevel,
                           cmMakefile *mf)
{
  if(!cmSystemTools::FileExists(filename) ||
     cmSystemTools::FileIsDirectory(filename))
    {
    return false;
    }

  bool parseError = false;

  {
  cmListFileParser parser(this, mf, filename);
  parseError = !parser.ParseFile();
  }

  // do we need a cmake_policy(VERSION call?
  if(topLevel)
  {
    bool hasVersion = false;
    // search for the right policy command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
    {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required")
      {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if(!hasVersion)
    {
      bool isProblem = true;
      if (this->Functions.size() < 30)
      {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for(std::vector<cmListFileFunction>::iterator i
              = this->Functions.begin();
            i != this->Functions.end(); ++i)
        {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end())
          {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem)
      {
      // Tell the top level cmMakefile to diagnose
      // this violation of CMP0000.
      mf->SetCheckCMP0000(true);

      // Implicitly set the version for the user.
      mf->SetPolicyVersion("2.4");
      }
    }
  }

  if(topLevel)
    {
    bool hasProject = false;
    // search for a project command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
      {
      if(cmSystemTools::LowerCase(i->Name) == "project")
        {
        hasProject = true;
        break;
        }
      }
    // if no project command is found, add one
    if(!hasProject)
      {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      this->Functions.insert(this->Functions.begin(),project);
      }
    }
  if(parseError)
    {
    return false;
    }
  return true;
}